

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void luaD_throw(lua_State *L,int errcode)

{
  lua_longjmp *plVar1;
  lua_State *plVar2;
  lua_CFunction p_Var3;
  StkId pTVar4;
  StkId pTVar5;
  
  plVar1 = L->errorJmp;
  if (plVar1 != (lua_longjmp *)0x0) {
    plVar1->status = errcode;
    longjmp((__jmp_buf_tag *)plVar1->b,1);
  }
  L->status = (lu_byte)errcode;
  plVar2 = L->l_G->mainthread;
  if (plVar2->errorJmp == (lua_longjmp *)0x0) {
    p_Var3 = L->l_G->panic;
    if (p_Var3 != (lua_CFunction)0x0) {
      (*p_Var3)(L);
    }
    abort();
  }
  pTVar4 = L->top;
  pTVar5 = plVar2->top;
  plVar2->top = pTVar5 + 1;
  pTVar5->value_ = pTVar4[-1].value_;
  pTVar5->tt_ = pTVar4[-1].tt_;
  luaD_throw(L->l_G->mainthread,errcode);
}

Assistant:

l_noret luaD_throw (lua_State *L, int errcode) {
  if (L->errorJmp) {  /* thread has an error handler? */
    L->errorJmp->status = errcode;  /* set status */
    LUAI_THROW(L, L->errorJmp);  /* jump to it */
  }
  else {  /* thread has no error handler */
    L->status = cast_byte(errcode);  /* mark it as dead */
    if (G(L)->mainthread->errorJmp) {  /* main thread has a handler? */
      setobjs2s(L, G(L)->mainthread->top++, L->top - 1);  /* copy error obj. */
      luaD_throw(G(L)->mainthread, errcode);  /* re-throw in main thread */
    }
    else {  /* no handler at all; abort */
      if (G(L)->panic) {  /* panic function? */
        lua_unlock(L);
        G(L)->panic(L);  /* call it (last chance to jump out) */
      }
      abort();
    }
  }
}